

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

LogParameter * __thiscall caffe::LogParameter::New(LogParameter *this,Arena *arena)

{
  LogParameter *this_00;
  
  this_00 = (LogParameter *)operator_new(0x28);
  LogParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::LogParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

LogParameter* LogParameter::New(::google::protobuf::Arena* arena) const {
  LogParameter* n = new LogParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}